

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

void wabt::cat_concatenate<std::__cxx11::string,std::__cxx11::string,char[4]>
               (string *s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [4])

{
  std::__cxx11::string::append((string *)s);
  cat_concatenate<std::__cxx11::string,char[4]>(s,args,args_1);
  return;
}

Assistant:

void cat_concatenate(std::string& s, const T& t, const Ts&... args) {
  s += t;
  cat_concatenate(s, args...);
}